

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::flag_&,_bool> * __thiscall
Catch::ExprLhs<const_type_safe::flag_&>::operator==
          (BinaryExpr<const_type_safe::flag_&,_bool> *__return_storage_ptr__,
          ExprLhs<const_type_safe::flag_&> *this,bool rhs)

{
  flag *lhs;
  bool comparisonResult;
  StringRef local_30;
  undefined1 local_1a;
  byte local_19;
  ExprLhs<const_type_safe::flag_&> *pEStack_18;
  bool rhs_local;
  ExprLhs<const_type_safe::flag_&> *this_local;
  
  local_1a = this->m_lhs->state_;
  local_19 = rhs;
  pEStack_18 = this;
  this_local = (ExprLhs<const_type_safe::flag_&> *)__return_storage_ptr__;
  comparisonResult = type_safe::operator==(local_1a,rhs);
  lhs = this->m_lhs;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_type_safe::flag_&,_bool>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,(bool)(local_19 & 1));
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( bool rhs ) -> BinaryExpr<LhsT, bool> const {
            return { m_lhs == rhs, m_lhs, "==", rhs };
        }